

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_intersection.cc
# Opt level: O0

bool __thiscall S2RegionIntersection::Contains(S2RegionIntersection *this,S2Point *p)

{
  int iVar1;
  uint uVar2;
  S2Region *pSVar3;
  int local_24;
  int i;
  S2Point *p_local;
  S2RegionIntersection *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = num_regions(this);
    if (iVar1 <= local_24) {
      return true;
    }
    pSVar3 = region(this,local_24);
    uVar2 = (*pSVar3->_vptr_S2Region[8])(pSVar3,p);
    if ((uVar2 & 1) == 0) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool S2RegionIntersection::Contains(const S2Point& p) const {
  for (int i = 0; i < num_regions(); ++i) {
    if (!region(i)->Contains(p)) return false;
  }
  return true;
}